

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_escaped_char<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char v)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  uint32_t cp;
  char v_array [1];
  char local_31;
  find_escape_result<char> local_30;
  
  sVar2 = (out.container)->size_;
  uVar3 = sVar2 + 1;
  local_31 = v;
  if ((out.container)->capacity_ < uVar3) {
    (*(out.container)->grow_)(out.container,uVar3);
    sVar2 = (out.container)->size_;
    uVar3 = sVar2 + 1;
  }
  (out.container)->size_ = uVar3;
  (out.container)->ptr_[sVar2] = '\'';
  cp = (uint32_t)v;
  bVar1 = true;
  if ((((0x1f < (byte)v) && (cp != 0x22)) && (cp != 0x5c)) && (cp != 0x7f)) {
    bVar1 = is_printable(cp);
    bVar1 = !bVar1;
  }
  if ((v == '\'') || ((bool)(v != '\"' & bVar1))) {
    local_30.begin = &local_31;
    local_30.end = (char *)&local_30;
    local_30.cp = cp;
    out = write_escaped_cp<fmt::v11::basic_appender<char>,char>(out,&local_30);
  }
  else {
    sVar2 = (out.container)->size_;
    uVar3 = sVar2 + 1;
    if ((out.container)->capacity_ < uVar3) {
      (*(out.container)->grow_)(out.container,uVar3);
      sVar2 = (out.container)->size_;
      uVar3 = sVar2 + 1;
    }
    (out.container)->size_ = uVar3;
    (out.container)->ptr_[sVar2] = v;
  }
  sVar2 = (out.container)->size_;
  uVar3 = sVar2 + 1;
  if ((out.container)->capacity_ < uVar3) {
    (*(out.container)->grow_)(out.container,uVar3);
    sVar2 = (out.container)->size_;
    uVar3 = sVar2 + 1;
  }
  (out.container)->size_ = uVar3;
  (out.container)->ptr_[sVar2] = '\'';
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}